

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O1

void __thiscall leveldb::RecoveryTest::DeleteManifestFile(RecoveryTest *this)

{
  Env *pEVar1;
  Status local_1d8;
  string local_1d0;
  Tester local_1b0;
  
  local_1b0.ok_ = true;
  local_1b0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
  ;
  local_1b0.line_ = 0x6c;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0.ss_);
  pEVar1 = this->env_;
  ManifestFileName_abi_cxx11_(&local_1d0,this);
  (*pEVar1->_vptr_Env[8])(&local_1d8,pEVar1,&local_1d0);
  test::Tester::IsOk(&local_1b0,&local_1d8);
  if (local_1d8.state_ != (char *)0x0) {
    operator_delete__(local_1d8.state_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  test::Tester::~Tester(&local_1b0);
  return;
}

Assistant:

void DeleteManifestFile() { ASSERT_OK(env_->DeleteFile(ManifestFileName())); }